

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ushort uVar1;
  short sVar2;
  char cVar3;
  int iVar4;
  BYTE *s;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  int iVar10;
  long *plVar11;
  int *piVar12;
  short *psVar13;
  ulong *puVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long *plVar18;
  ulong *puVar19;
  ulong *puVar20;
  uint uVar21;
  BYTE *e_4;
  long lVar22;
  char *pcVar23;
  BYTE *e;
  int *piVar24;
  uint uVar25;
  char *pcVar26;
  long *plVar27;
  int *piVar28;
  int *piVar29;
  undefined4 in_register_00000084;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  ulong uVar33;
  char cVar34;
  int iVar35;
  long lVar36;
  BYTE *e_1;
  uint uVar37;
  char *pcVar38;
  BYTE *d;
  short *psVar39;
  ulong uVar40;
  long *plVar41;
  uint uVar42;
  BYTE *s_4;
  char *pcVar43;
  bool bVar44;
  bool bVar45;
  U16 *hashTable;
  long *local_c8;
  short *local_c0;
  long *local_b0;
  
  piVar12 = (int *)CONCAT44(in_register_00000084,dstCapacity);
  iVar35 = 1;
  if (1 < acceleration) {
    iVar35 = acceleration;
  }
  if (0x10000 < iVar35) {
    iVar35 = 0x10001;
  }
  iVar10 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar10 = (uint)((ulong)(uint)srcSize * 0x8080808081 >> 0x27) + 0x10;
  }
  iVar16 = *(int *)((long)state + 0x4004);
  sVar2 = (short)src;
  iVar4 = (int)dst;
  if (dstCapacity < iVar10) {
    if (0x1000a < srcSize) {
      if (iVar16 != 0) {
        memset(state,0,0x4008);
      }
      if (*(int *)((long)state + 0x4000) != 0) {
        *(int *)((long)state + 0x4000) = *(int *)((long)state + 0x4000) + 0x10000;
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      uVar21 = *(uint *)((long)state + 0x4000);
      lVar22 = (long)src - (ulong)uVar21;
      plVar18 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
      pcVar38 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar21;
      *(undefined4 *)((long)state + 0x4004) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar21;
      plVar41 = (long *)(src + 1);
      uVar40 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
      piVar12 = (int *)src;
      local_b0 = (long *)src;
      do {
        uVar42 = 1;
        uVar21 = iVar35 << 6;
        while( true ) {
          plVar27 = (long *)((ulong)uVar42 + (long)plVar41);
          iVar10 = (int)plVar41;
          iVar16 = (int)lVar22;
          if (plVar18 < plVar27) {
            iVar15 = 2;
          }
          else {
            uVar42 = *(uint *)((long)state + uVar40 * 4);
            piVar12 = (int *)((ulong)uVar42 + lVar22);
            uVar6 = (ulong)(*plVar27 * -0x30e4432345000000) >> 0x34;
            *(int *)((long)state + uVar40 * 4) = iVar10 - iVar16;
            iVar15 = 8;
            uVar40 = uVar6;
            if (((uint)(iVar10 - iVar16) <= uVar42 + 0xffff) &&
               (iVar15 = 7, *piVar12 != (int)*plVar41)) {
              iVar15 = 0;
            }
          }
          if ((iVar15 != 0) && (iVar15 != 8)) break;
          uVar42 = uVar21 >> 6;
          uVar21 = uVar21 + 1;
          plVar41 = plVar27;
        }
        if (iVar15 == 7) {
          iVar15 = 0;
        }
        plVar27 = (long *)dst;
        if (iVar15 == 0) {
          uVar42 = iVar10 - (int)local_b0;
          lVar7 = 0;
          uVar21 = uVar42 - 0xf;
          cVar3 = (char)plVar41 * '\x10' + (char)local_b0 * -0x10;
          do {
            cVar34 = cVar3;
            uVar25 = uVar21;
            lVar36 = lVar7;
            piVar28 = (int *)((long)piVar12 + lVar36);
            plVar5 = (long *)((long)plVar41 + lVar36);
            if ((piVar28 <= src) || (plVar5 <= local_b0)) break;
            lVar7 = lVar36 + -1;
            uVar21 = uVar25 - 1;
            cVar3 = cVar34 + -0x10;
          } while (*(char *)((long)plVar41 + lVar36 + -1) == *(char *)((long)piVar12 + lVar36 + -1))
          ;
          iVar15 = (int)lVar36;
          uVar6 = (ulong)(uint)(iVar15 + (iVar10 - (int)local_b0));
          plVar27 = (long *)((long)dst + 1);
          pcVar23 = (char *)((long)dst + ((ulong)uVar42 + lVar36 & 0xffffffff) / 0xff + uVar6 + 9);
          if (pcVar38 < pcVar23) {
            iVar15 = 1;
          }
          else {
            if ((uint)((ulong)uVar42 + lVar36) < 0xf) {
              *dst = cVar34;
              plVar41 = plVar27;
            }
            else {
              uVar31 = (ulong)(uVar42 - 0xf) + lVar36;
              *dst = -0x10;
              if (0xfe < (int)uVar31) {
                if (0x1fc < (int)uVar25) {
                  uVar25 = 0x1fd;
                }
                uVar21 = (uVar42 - uVar25) + iVar15 + 0xef;
                uVar31 = (ulong)uVar21 / 0xff;
                memset(plVar27,0xff,(ulong)(uVar21 / 0xff + 1));
                plVar27 = (long *)((long)dst + uVar31 + 2);
                uVar31 = (ulong)((uVar42 - 0x10e) + iVar15 + (int)uVar31 * -0xff);
              }
              *(char *)plVar27 = (char)uVar31;
              plVar41 = (long *)((long)plVar27 + 1);
            }
            plVar27 = (long *)(uVar6 + (long)plVar41);
            plVar11 = local_b0;
            do {
              *plVar41 = *plVar11;
              plVar41 = plVar41 + 1;
              plVar11 = plVar11 + 1;
            } while (plVar41 < plVar27);
            iVar15 = 0;
          }
          plVar41 = plVar5;
          piVar12 = piVar28;
          if (pcVar23 <= pcVar38) {
            do {
              *(short *)plVar27 = (short)plVar5 - (short)piVar28;
              puVar20 = (ulong *)((long)plVar5 + 4);
              puVar19 = (ulong *)(piVar28 + 1);
              puVar14 = puVar20;
              plVar41 = plVar18;
              if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
                uVar31 = *(ulong *)((long)plVar5 + 4) ^ *(ulong *)(piVar28 + 1);
                uVar6 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                plVar41 = (long *)(uVar6 >> 3 & 0x1fffffff);
                uVar21 = (uint)plVar41;
                puVar14 = (ulong *)((long)plVar5 + 0xc);
                puVar19 = (ulong *)(piVar28 + 3);
                if (*(ulong *)(piVar28 + 1) == *(ulong *)((long)plVar5 + 4)) goto LAB_0013983d;
              }
              else {
LAB_0013983d:
                do {
                  if (src + ((ulong)(uint)srcSize - 0xc) <= puVar14) {
                    if ((puVar14 < src + ((ulong)(uint)srcSize - 8)) &&
                       ((int)*puVar19 == (int)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar14 < src + ((ulong)(uint)srcSize - 6)) &&
                       ((short)*puVar19 == (short)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar14 < src + ((ulong)(uint)srcSize - 5)) {
                      puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar19 == (char)*puVar14))
                      ;
                    }
                    uVar21 = (int)puVar14 - (int)puVar20;
                    break;
                  }
                  uVar6 = *puVar19;
                  uVar33 = *puVar14 ^ uVar6;
                  uVar31 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  puVar32 = (ulong *)((uVar31 >> 3 & 0x1fffffff) + (long)puVar14);
                  puVar19 = puVar19 + 1;
                  bVar44 = uVar6 == *puVar14;
                  puVar14 = puVar14 + 1;
                  if (!bVar44) {
                    puVar14 = puVar32;
                  }
                  plVar41 = (long *)((ulong)plVar41 & 0xffffffff);
                  if (!bVar44) {
                    plVar41 = (long *)(ulong)(uint)((int)puVar32 - (int)puVar20);
                  }
                  uVar21 = (uint)plVar41;
                } while (bVar44);
              }
              plVar11 = (long *)((long)plVar27 + 2);
              pcVar23 = (char *)((long)plVar27 + (ulong)(uVar21 + 0xf0) / 0xff + 8);
              if (pcVar23 <= pcVar38) {
                if (uVar21 < 0xf) {
                  *dst = (char)*(long *)dst + (char)uVar21;
                }
                else {
                  *dst = (char)*(long *)dst + '\x0f';
                  uVar42 = uVar21 - 0xf;
                  *(undefined4 *)plVar11 = 0xffffffff;
                  if (0x3fb < uVar42) {
                    uVar25 = uVar21 - 0x40b;
                    memset((char *)((long)plVar27 + 6),0xff,(ulong)((uVar25 / 0x3fc) * 4 + 4));
                    uVar42 = uVar25 % 0x3fc;
                    plVar11 = (long *)((long)plVar27 + (ulong)((uVar25 / 0x3fc) * 4) + 6);
                  }
                  pcVar43 = (char *)((long)plVar11 + (ulong)uVar42 / 0xff);
                  plVar11 = (long *)(pcVar43 + 1);
                  *pcVar43 = (char)(uVar42 / 0xff) + (char)uVar42;
                }
              }
              lVar7 = (ulong)uVar21 + (long)plVar5;
              plVar5 = (long *)(lVar7 + 4);
              plVar41 = plVar5;
              piVar12 = piVar28;
              plVar27 = plVar11;
              if (pcVar38 < pcVar23) {
                iVar15 = 1;
                goto LAB_00139abc;
              }
              local_b0 = plVar5;
              if (plVar18 <= plVar5) {
                iVar15 = 3;
                goto LAB_00139abc;
              }
              *(int *)((long)state +
                      ((ulong)(*(long *)(lVar7 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)lVar7 + 2) - iVar16;
              uVar6 = (ulong)(*plVar5 * -0x30e4432345000000) >> 0x34;
              uVar42 = (int)plVar5 - iVar16;
              uVar21 = *(uint *)((long)state + uVar6 * 4);
              piVar28 = (int *)((ulong)uVar21 + lVar22);
              *(uint *)((long)state + uVar6 * 4) = uVar42;
              bVar44 = true;
              if ((uVar42 <= uVar21 + 0xffff) && (*piVar28 == *(int *)plVar5)) {
                *(char *)plVar11 = '\0';
                bVar44 = false;
                dst = (char *)plVar11;
                plVar11 = (long *)((long)plVar11 + 1);
              }
              plVar27 = plVar11;
            } while (!bVar44);
            uVar40 = (ulong)(*(long *)(lVar7 + 5) * -0x30e4432345000000) >> 0x34;
            iVar15 = 0;
            plVar41 = (long *)(lVar7 + 5);
            piVar12 = piVar28;
          }
        }
LAB_00139abc:
        dst = (char *)plVar27;
        if (iVar15 != 0) {
          if (1 < iVar15 - 2U) {
            return 0;
          }
          pcVar43 = src + ((ulong)(uint)srcSize - (long)local_b0);
          pcVar23 = (char *)((long)plVar27 + (long)(pcVar43 + (ulong)(pcVar43 + 0xf0) / 0xff + 1));
          if (pcVar23 <= pcVar38) {
            if (pcVar43 < (char *)0xf) {
              *(char *)plVar27 = (char)pcVar43 << 4;
            }
            else {
              pcVar9 = pcVar43 + -0xf;
              *(char *)plVar27 = -0x10;
              plVar41 = (long *)((long)plVar27 + 1);
              if ((char *)0xfe < pcVar9) {
                uVar40 = (ulong)(pcVar43 + -0x10e) / 0xff;
                memset(plVar41,0xff,uVar40 + 1);
                plVar41 = (long *)((long)plVar27 + uVar40 + 2);
                pcVar9 = pcVar43 + uVar40 * -0xff + -0x10e;
              }
              *(char *)plVar41 = (char)pcVar9;
              plVar27 = plVar41;
            }
            memcpy((char *)((long)plVar27 + 1),local_b0,(size_t)pcVar43);
            plVar27 = (long *)((long)plVar27 + (long)(pcVar43 + 1));
          }
          if (pcVar38 < pcVar23) {
            return 0;
          }
          return (int)plVar27 - iVar4;
        }
      } while( true );
    }
    if ((iVar16 != 0) &&
       (((iVar16 != 3 || (0xfff < srcSize)) ||
        (0xfffe < (uint)(*(int *)((long)state + 0x4000) + srcSize))))) {
      memset(state,0,0x4008);
    }
    uVar21 = *(uint *)((long)state + 0x4000);
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    *(undefined4 *)((long)state + 0x4018) = 0;
    if ((ulong)uVar21 == 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize != 0) {
        pcVar38 = src + (uint)srcSize;
        pcVar23 = dst + dstCapacity;
        *(int *)((long)state + 0x4018) = srcSize;
        *(int *)((long)state + 0x4000) = srcSize;
        *(undefined4 *)((long)state + 0x4004) = 3;
        local_c8 = (long *)dst;
        if (0xc < srcSize) {
          *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
          piVar12 = (int *)(src + 1);
          uVar21 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
          piVar28 = (int *)src;
          pcVar43 = pcVar38;
          do {
            uVar40 = 1;
            piVar24 = piVar12;
            uVar42 = iVar35 << 6;
            do {
              piVar12 = piVar24;
              piVar24 = (int *)(uVar40 + (long)piVar12);
              if (src + ((ulong)(uint)srcSize - 0xb) < piVar24) {
                iVar10 = 2;
              }
              else {
                uVar1 = *(ushort *)((long)state + (ulong)uVar21 * 2);
                iVar16 = *piVar24;
                *(short *)((long)state + (ulong)uVar21 * 2) = (short)piVar12 - sVar2;
                iVar10 = 7;
                if (*(int *)(src + uVar1) != *piVar12) {
                  iVar10 = 0;
                }
                pcVar43 = src + uVar1;
                uVar21 = (uint)(iVar16 * -0x61c8864f) >> 0x13;
              }
              uVar40 = (ulong)(uVar42 >> 6);
              uVar42 = uVar42 + 1;
            } while (iVar10 == 0);
            if (iVar10 == 7) {
              iVar10 = 0;
            }
            plVar41 = local_c8;
            if (iVar10 == 0) {
              uVar25 = (int)piVar12 - (int)piVar28;
              lVar22 = 0;
              uVar42 = uVar25 - 0xf;
              cVar3 = (char)piVar12 * '\x10' + (char)piVar28 * -0x10;
              do {
                cVar34 = cVar3;
                uVar17 = uVar42;
                lVar7 = lVar22;
                pcVar9 = pcVar43 + lVar7;
                piVar24 = (int *)((long)piVar12 + lVar7);
                if ((pcVar9 <= src) || (piVar24 <= piVar28)) break;
                lVar22 = lVar7 + -1;
                uVar42 = uVar17 - 1;
                cVar3 = cVar34 + -0x10;
              } while (*(char *)((long)piVar12 + lVar7 + -1) == pcVar43[lVar7 + -1]);
              iVar10 = (int)lVar7;
              uVar40 = (ulong)(uint)(((int)piVar12 - (int)piVar28) + iVar10);
              plVar41 = (long *)((long)local_c8 + 1);
              pcVar26 = (char *)((long)local_c8 +
                                ((ulong)uVar25 + lVar7 & 0xffffffff) / 0xff + uVar40 + 9);
              if (pcVar23 < pcVar26) {
                iVar10 = 1;
              }
              else {
                if ((uint)((ulong)uVar25 + lVar7) < 0xf) {
                  *(char *)local_c8 = cVar34;
                  psVar39 = (short *)plVar41;
                }
                else {
                  uVar6 = (ulong)(uVar25 - 0xf) + lVar7;
                  *(char *)local_c8 = -0x10;
                  if (0xfe < (int)uVar6) {
                    if (0x1fc < (int)uVar17) {
                      uVar17 = 0x1fd;
                    }
                    uVar42 = (uVar25 - uVar17) + iVar10 + 0xef;
                    uVar6 = (ulong)uVar42 / 0xff;
                    memset(plVar41,0xff,(ulong)(uVar42 / 0xff + 1));
                    plVar41 = (long *)((long)local_c8 + uVar6 + 2);
                    uVar6 = (ulong)((uVar25 - 0x10e) + iVar10 + (int)uVar6 * -0xff);
                  }
                  *(char *)plVar41 = (char)uVar6;
                  psVar39 = (short *)((long)plVar41 + 1);
                }
                plVar41 = (long *)(uVar40 + (long)psVar39);
                piVar12 = piVar28;
                do {
                  *(undefined8 *)psVar39 = *(undefined8 *)piVar12;
                  psVar39 = psVar39 + 4;
                  piVar12 = piVar12 + 2;
                } while (psVar39 < plVar41);
                iVar10 = 0;
              }
              piVar12 = piVar24;
              pcVar43 = pcVar9;
              if (pcVar26 <= pcVar23) {
                do {
                  *(short *)plVar41 = (short)piVar24 - (short)pcVar9;
                  puVar20 = (ulong *)(piVar24 + 1);
                  puVar19 = (ulong *)(pcVar9 + 4);
                  puVar14 = puVar20;
                  if (puVar20 < pcVar38 + -0xc) {
                    uVar6 = *(ulong *)(piVar24 + 1) ^ *(ulong *)(pcVar9 + 4);
                    uVar40 = 0;
                    if (uVar6 != 0) {
                      for (; (uVar6 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    uVar40 = uVar40 >> 3 & 0x1fffffff;
                    puVar14 = (ulong *)(piVar24 + 3);
                    puVar19 = (ulong *)(pcVar9 + 0xc);
                    if (*(ulong *)(pcVar9 + 4) == *(ulong *)(piVar24 + 1)) goto LAB_0013b07f;
                  }
                  else {
LAB_0013b07f:
                    do {
                      if (pcVar38 + -0xc <= puVar14) {
                        if ((puVar14 < pcVar38 + -8) && ((int)*puVar19 == (int)*puVar14)) {
                          puVar14 = (ulong *)((long)puVar14 + 4);
                          puVar19 = (ulong *)((long)puVar19 + 4);
                        }
                        if ((puVar14 < pcVar38 + -6) && ((short)*puVar19 == (short)*puVar14)) {
                          puVar14 = (ulong *)((long)puVar14 + 2);
                          puVar19 = (ulong *)((long)puVar19 + 2);
                        }
                        if (puVar14 < src + ((ulong)(uint)srcSize - 5)) {
                          puVar14 = (ulong *)((long)puVar14 +
                                             (ulong)((char)*puVar19 == (char)*puVar14));
                        }
                        uVar40 = (ulong)(uint)((int)puVar14 - (int)puVar20);
                        goto LAB_0013b0bc;
                      }
                      uVar40 = *puVar19;
                      uVar6 = *puVar14;
                      uVar33 = uVar6 ^ uVar40;
                      uVar31 = 0;
                      if (uVar33 != 0) {
                        for (; (uVar33 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      iVar10 = (int)puVar14;
                      puVar19 = puVar19 + 1;
                      puVar14 = puVar14 + 1;
                    } while (uVar40 == uVar6);
                    uVar40 = (ulong)((((uint)(uVar31 >> 3) & 0x1fffffff) + iVar10) - (int)puVar20);
                  }
LAB_0013b0bc:
                  psVar39 = (short *)((long)plVar41 + 2);
                  uVar42 = (uint)uVar40;
                  pcVar26 = (char *)((long)plVar41 + (ulong)(uVar42 + 0xf0) / 0xff + 8);
                  if (pcVar26 <= pcVar23) {
                    if (uVar42 < 0xf) {
                      *(char *)local_c8 = (char)*local_c8 + (char)uVar40;
                    }
                    else {
                      *(char *)local_c8 = (char)*local_c8 + '\x0f';
                      uVar25 = uVar42 - 0xf;
                      psVar39[0] = -1;
                      psVar39[1] = -1;
                      if (0x3fb < uVar25) {
                        uVar42 = uVar42 - 0x40b;
                        memset((short *)((long)plVar41 + 6),0xff,(ulong)((uVar42 / 0x3fc) * 4 + 4));
                        uVar25 = uVar42 % 0x3fc;
                        psVar39 = (short *)((long)plVar41 + (ulong)((uVar42 / 0x3fc) * 4) + 6);
                      }
                      pcVar43 = (char *)((long)psVar39 + (ulong)uVar25 / 0xff);
                      psVar39 = (short *)(pcVar43 + 1);
                      *pcVar43 = (char)(uVar25 / 0xff) + (char)uVar25;
                    }
                  }
                  lVar22 = (long)piVar24 + uVar40;
                  piVar24 = (int *)(lVar22 + 4);
                  piVar12 = piVar24;
                  plVar41 = (long *)psVar39;
                  pcVar43 = pcVar9;
                  if (pcVar23 < pcVar26) {
                    iVar10 = 1;
                    goto LAB_0013b2b0;
                  }
                  piVar28 = piVar24;
                  if (src + ((ulong)(uint)srcSize - 0xb) <= piVar24) {
                    iVar10 = 3;
                    goto LAB_0013b2b0;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar22 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar22 + 2) - sVar2;
                  uVar40 = (ulong)((uint)(*piVar24 * -0x61c8864f) >> 0x13);
                  uVar1 = *(ushort *)((long)state + uVar40 * 2);
                  *(short *)((long)state + uVar40 * 2) = (short)piVar24 - sVar2;
                  iVar10 = *(int *)(src + uVar1);
                  iVar16 = *piVar24;
                  if (iVar10 == iVar16) {
                    *(char *)psVar39 = '\0';
                    plVar41 = (long *)((long)psVar39 + 1);
                    local_c8 = (long *)psVar39;
                  }
                  pcVar9 = src + uVar1;
                } while (iVar10 == iVar16);
                piVar12 = (int *)(lVar22 + 5);
                uVar21 = (uint)(*(int *)(lVar22 + 5) * -0x61c8864f) >> 0x13;
                iVar10 = 0;
                pcVar43 = pcVar9;
              }
            }
LAB_0013b2b0:
            local_c8 = plVar41;
          } while (iVar10 == 0);
          src = (char *)piVar28;
          if (1 < iVar10 - 2U) {
            return 0;
          }
        }
        uVar40 = (long)pcVar38 - (long)src;
        pcVar38 = (char *)((long)local_c8 + (uVar40 + 0xf0) / 0xff + uVar40 + 1);
        if (pcVar38 <= pcVar23) {
          if (uVar40 < 0xf) {
            *(char *)local_c8 = (char)uVar40 << 4;
          }
          else {
            uVar6 = uVar40 - 0xf;
            *(char *)local_c8 = -0x10;
            psVar39 = (short *)((long)local_c8 + 1);
            if (0xfe < uVar6) {
              uVar31 = (uVar40 - 0x10e) / 0xff;
              memset((short *)((long)local_c8 + 1),0xff,uVar31 + 1);
              uVar6 = (uVar40 + uVar31 * -0xff) - 0x10e;
              psVar39 = (short *)((long)local_c8 + uVar31 + 2);
            }
            local_c8 = (long *)psVar39;
            *(char *)local_c8 = (char)uVar6;
          }
          memcpy((char *)((long)local_c8 + 1),src,uVar40);
          local_c8 = (long *)((long)local_c8 + uVar40 + 1);
        }
        iVar35 = (int)local_c8;
        bVar44 = pcVar38 < pcVar23;
        bVar45 = pcVar38 == pcVar23;
        goto LAB_0013b8a7;
      }
    }
    else {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize != 0) {
        pcVar38 = dst + dstCapacity;
        *(int *)((long)state + 0x4018) = srcSize;
        *(uint *)((long)state + 0x4000) = uVar21 + srcSize;
        *(undefined4 *)((long)state + 0x4004) = 3;
        local_c0 = (short *)dst;
        local_c8 = (long *)src;
        if (0xc < srcSize) {
          lVar22 = (long)src - (ulong)uVar21;
          piVar24 = (int *)(src + ((ulong)(uint)srcSize - 0xb));
          *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar21;
          piVar28 = (int *)(src + 1);
          uVar42 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
          do {
            uVar17 = 1;
            uVar25 = iVar35 << 6;
            while( true ) {
              piVar29 = (int *)((ulong)uVar17 + (long)piVar28);
              sVar2 = (short)lVar22;
              if (piVar24 < piVar29) {
                iVar10 = 2;
              }
              else {
                uVar40 = (ulong)uVar42;
                uVar1 = *(ushort *)((long)state + uVar40 * 2);
                piVar12 = (int *)((ulong)uVar1 + lVar22);
                uVar42 = (uint)(*piVar29 * -0x61c8864f) >> 0x13;
                *(short *)((long)state + uVar40 * 2) = (short)piVar28 - sVar2;
                iVar10 = 8;
                if ((uVar21 <= uVar1) && (iVar10 = 7, *piVar12 != *piVar28)) {
                  iVar10 = 0;
                }
              }
              if ((iVar10 != 0) && (iVar10 != 8)) break;
              uVar17 = uVar25 >> 6;
              uVar25 = uVar25 + 1;
              piVar28 = piVar29;
            }
            if (iVar10 == 7) {
              iVar10 = 0;
            }
            psVar39 = local_c0;
            if (iVar10 == 0) {
              uVar17 = (int)piVar28 - (int)local_c8;
              lVar7 = 0;
              cVar3 = (char)piVar28 * '\x10' + (char)local_c8 * -0x10;
              uVar25 = uVar17 - 0xf;
              do {
                uVar37 = uVar25;
                cVar34 = cVar3;
                lVar36 = lVar7;
                piVar29 = (int *)((long)piVar12 + lVar36);
                piVar8 = (int *)((long)piVar28 + lVar36);
                if ((piVar29 <= src) || (piVar8 <= local_c8)) break;
                lVar7 = lVar36 + -1;
                cVar3 = cVar34 + -0x10;
                uVar25 = uVar37 - 1;
              } while (*(char *)((long)piVar28 + lVar36 + -1) ==
                       *(char *)((long)piVar12 + lVar36 + -1));
              iVar10 = (int)lVar36;
              uVar40 = (ulong)(uint)(((int)piVar28 - (int)local_c8) + iVar10);
              psVar39 = (short *)((long)local_c0 + 1);
              pcVar23 = (char *)((long)local_c0 +
                                ((ulong)uVar17 + lVar36 & 0xffffffff) / 0xff + uVar40 + 9);
              if (pcVar38 < pcVar23) {
                iVar10 = 1;
              }
              else {
                if ((uint)((ulong)uVar17 + lVar36) < 0xf) {
                  *(char *)local_c0 = cVar34;
                  psVar13 = psVar39;
                }
                else {
                  uVar6 = (ulong)(uVar17 - 0xf) + lVar36;
                  *(char *)local_c0 = -0x10;
                  if (0xfe < (int)uVar6) {
                    if (0x1fc < (int)uVar37) {
                      uVar37 = 0x1fd;
                    }
                    uVar25 = (uVar17 - uVar37) + iVar10 + 0xef;
                    uVar6 = (ulong)uVar25 / 0xff;
                    memset(psVar39,0xff,(ulong)(uVar25 / 0xff + 1));
                    psVar39 = (short *)((long)local_c0 + uVar6 + 2);
                    uVar6 = (ulong)((uVar17 - 0x10e) + iVar10 + (int)uVar6 * -0xff);
                  }
                  *(char *)psVar39 = (char)uVar6;
                  psVar13 = (short *)((long)psVar39 + 1);
                }
                psVar39 = (short *)(uVar40 + (long)psVar13);
                plVar41 = local_c8;
                do {
                  *(long *)psVar13 = *plVar41;
                  psVar13 = psVar13 + 4;
                  plVar41 = (long *)((long)plVar41 + 8);
                } while (psVar13 < psVar39);
                iVar10 = 0;
              }
              piVar28 = piVar8;
              piVar12 = piVar29;
              if (pcVar23 <= pcVar38) {
                do {
                  *psVar39 = (short)piVar8 - (short)piVar29;
                  puVar20 = (ulong *)(piVar8 + 1);
                  puVar19 = (ulong *)(piVar29 + 1);
                  puVar14 = puVar20;
                  piVar12 = piVar24;
                  if (puVar20 < src + ((ulong)(uint)srcSize - 0xc)) {
                    uVar6 = *(ulong *)(piVar8 + 1) ^ *(ulong *)(piVar29 + 1);
                    uVar40 = 0;
                    if (uVar6 != 0) {
                      for (; (uVar6 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    piVar12 = (int *)(uVar40 >> 3 & 0x1fffffff);
                    uVar25 = (uint)piVar12;
                    puVar14 = (ulong *)(piVar8 + 3);
                    puVar19 = (ulong *)(piVar29 + 3);
                    if (*(ulong *)(piVar29 + 1) == *(ulong *)(piVar8 + 1)) goto LAB_0013a525;
                  }
                  else {
LAB_0013a525:
                    do {
                      if (src + ((ulong)(uint)srcSize - 0xc) <= puVar14) {
                        if ((puVar14 < src + ((ulong)(uint)srcSize - 8)) &&
                           ((int)*puVar19 == (int)*puVar14)) {
                          puVar14 = (ulong *)((long)puVar14 + 4);
                          puVar19 = (ulong *)((long)puVar19 + 4);
                        }
                        if ((puVar14 < src + ((ulong)(uint)srcSize - 6)) &&
                           ((short)*puVar19 == (short)*puVar14)) {
                          puVar14 = (ulong *)((long)puVar14 + 2);
                          puVar19 = (ulong *)((long)puVar19 + 2);
                        }
                        if (puVar14 < src + ((ulong)(uint)srcSize - 5)) {
                          puVar14 = (ulong *)((long)puVar14 +
                                             (ulong)((char)*puVar19 == (char)*puVar14));
                        }
                        uVar25 = (int)puVar14 - (int)puVar20;
                        break;
                      }
                      uVar40 = *puVar19;
                      uVar31 = *puVar14 ^ uVar40;
                      uVar6 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                        }
                      }
                      puVar32 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar14);
                      puVar19 = puVar19 + 1;
                      bVar44 = uVar40 == *puVar14;
                      puVar14 = puVar14 + 1;
                      if (!bVar44) {
                        puVar14 = puVar32;
                      }
                      piVar12 = (int *)((ulong)piVar12 & 0xffffffff);
                      if (!bVar44) {
                        piVar12 = (int *)(ulong)(uint)((int)puVar32 - (int)puVar20);
                      }
                      uVar25 = (uint)piVar12;
                    } while (bVar44);
                  }
                  psVar13 = psVar39 + 1;
                  pcVar23 = (char *)((long)psVar39 + (ulong)(uVar25 + 0xf0) / 0xff + 8);
                  if (pcVar23 <= pcVar38) {
                    if (uVar25 < 0xf) {
                      *(char *)local_c0 = (char)*local_c0 + (char)uVar25;
                    }
                    else {
                      *(char *)local_c0 = (char)*local_c0 + '\x0f';
                      uVar17 = uVar25 - 0xf;
                      psVar13[0] = -1;
                      psVar13[1] = -1;
                      if (0x3fb < uVar17) {
                        uVar37 = uVar25 - 0x40b;
                        memset(psVar39 + 3,0xff,(ulong)((uVar37 / 0x3fc) * 4 + 4));
                        uVar17 = uVar37 % 0x3fc;
                        psVar13 = (short *)((long)psVar39 + (ulong)((uVar37 / 0x3fc) * 4) + 6);
                      }
                      pcVar43 = (char *)((long)psVar13 + (ulong)uVar17 / 0xff);
                      psVar13 = (short *)(pcVar43 + 1);
                      *pcVar43 = (char)(uVar17 / 0xff) + (char)uVar17;
                    }
                  }
                  lVar7 = (ulong)uVar25 + (long)piVar8;
                  piVar8 = (int *)(lVar7 + 4);
                  piVar28 = piVar8;
                  piVar12 = piVar29;
                  psVar39 = psVar13;
                  if (pcVar38 < pcVar23) {
                    iVar10 = 1;
                    goto LAB_0013a797;
                  }
                  local_c8 = (long *)piVar8;
                  if (piVar24 <= piVar8) {
                    iVar10 = 3;
                    goto LAB_0013a797;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar7 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar7 + 2) - sVar2;
                  uVar40 = (ulong)((uint)(*piVar8 * -0x61c8864f) >> 0x13);
                  uVar1 = *(ushort *)((long)state + uVar40 * 2);
                  piVar29 = (int *)((ulong)uVar1 + lVar22);
                  *(short *)((long)state + uVar40 * 2) = (short)piVar8 - sVar2;
                  bVar44 = true;
                  if ((uVar21 <= uVar1) && (*piVar29 == *piVar8)) {
                    *(char *)psVar13 = '\0';
                    bVar44 = false;
                    psVar39 = (short *)((long)psVar13 + 1);
                    local_c0 = psVar13;
                  }
                } while (!bVar44);
                uVar42 = (uint)(*(int *)(lVar7 + 5) * -0x61c8864f) >> 0x13;
                iVar10 = 0;
                piVar28 = (int *)(lVar7 + 5);
                piVar12 = piVar29;
              }
            }
LAB_0013a797:
            local_c0 = psVar39;
          } while (iVar10 == 0);
          if (1 < iVar10 - 2U) {
            return 0;
          }
        }
        pcVar43 = src + ((ulong)(uint)srcSize - (long)local_c8);
        pcVar23 = (char *)((long)local_c0 + (long)(pcVar43 + (ulong)(pcVar43 + 0xf0) / 0xff + 1));
        if (pcVar23 <= pcVar38) {
          if (pcVar43 < (char *)0xf) {
            *(char *)local_c0 = (char)pcVar43 << 4;
          }
          else {
            pcVar9 = pcVar43 + -0xf;
            *(char *)local_c0 = -0x10;
            psVar39 = (short *)((long)local_c0 + 1);
            if ((char *)0xfe < pcVar9) {
              uVar40 = (ulong)(pcVar43 + -0x10e) / 0xff;
              memset((short *)((long)local_c0 + 1),0xff,uVar40 + 1);
              pcVar9 = pcVar43 + uVar40 * -0xff + -0x10e;
              psVar39 = (short *)((long)local_c0 + uVar40 + 2);
            }
            local_c0 = psVar39;
            *(char *)local_c0 = (char)pcVar9;
          }
          memcpy((char *)((long)local_c0 + 1),local_c8,(size_t)pcVar43);
          local_c0 = (short *)((long)local_c0 + (long)(pcVar43 + 1));
        }
        iVar35 = (int)local_c0;
        bVar44 = pcVar23 < pcVar38;
        bVar45 = pcVar23 == pcVar38;
LAB_0013b8a7:
        if (bVar44 || bVar45) {
          return iVar35 - iVar4;
        }
        return 0;
      }
    }
    if (dstCapacity < 1) {
      return 0;
    }
LAB_0013a1ed:
    *dst = '\0';
    return 1;
  }
  plVar41 = (long *)src;
  if (srcSize < 0x1000b) {
    if ((iVar16 != 0) &&
       (((iVar16 != 3 || (0xfff < srcSize)) ||
        (0xfffe < (uint)(*(int *)((long)state + 0x4000) + srcSize))))) {
      memset(state,0,0x4008);
    }
    uVar21 = *(uint *)((long)state + 0x4000);
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    *(undefined4 *)((long)state + 0x4018) = 0;
    if ((ulong)uVar21 != 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      if (srcSize == 0) goto LAB_0013a1ed;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = uVar21 + srcSize;
      *(undefined4 *)((long)state + 0x4004) = 3;
      piVar28 = (int *)src;
      if (0xc < srcSize) {
        lVar22 = (long)src - (ulong)uVar21;
        *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar21;
        piVar24 = (int *)(src + 1);
        uVar42 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
        do {
          uVar17 = 1;
          uVar25 = iVar35 << 6;
          while( true ) {
            piVar29 = (int *)((ulong)uVar17 + (long)piVar24);
            sVar2 = (short)lVar22;
            if (src + ((ulong)(uint)srcSize - 0xb) < piVar29) {
              iVar10 = 2;
            }
            else {
              uVar40 = (ulong)uVar42;
              uVar1 = *(ushort *)((long)state + uVar40 * 2);
              piVar12 = (int *)((ulong)uVar1 + lVar22);
              uVar42 = (uint)(*piVar29 * -0x61c8864f) >> 0x13;
              *(short *)((long)state + uVar40 * 2) = (short)piVar24 - sVar2;
              iVar10 = 8;
              if ((uVar21 <= uVar1) && (iVar10 = 7, *piVar12 != *piVar24)) {
                iVar10 = 0;
              }
            }
            if ((iVar10 != 0) && (iVar10 != 8)) break;
            uVar17 = uVar25 >> 6;
            uVar25 = uVar25 + 1;
            piVar24 = piVar29;
          }
          if (iVar10 == 7) {
            iVar10 = 0;
          }
          if (iVar10 == 0) {
            iVar10 = (int)piVar24 - (int)piVar28;
            lVar7 = 0;
            uVar25 = iVar10 - 0xfU;
            cVar3 = (char)piVar24 * '\x10' + (char)piVar28 * -0x10;
            do {
              cVar34 = cVar3;
              uVar17 = uVar25;
              lVar36 = lVar7;
              piVar29 = (int *)((long)piVar12 + lVar36);
              piVar8 = (int *)((long)piVar24 + lVar36);
              if ((piVar29 <= src) || (piVar8 <= piVar28)) break;
              lVar7 = lVar36 + -1;
              uVar25 = uVar17 - 1;
              cVar3 = cVar34 + -0x10;
            } while (*(char *)((long)piVar24 + lVar36 + -1) ==
                     *(char *)((long)piVar12 + lVar36 + -1));
            iVar16 = (int)lVar36;
            psVar39 = (short *)((long)dst + 1);
            if ((uint)(iVar10 + iVar16) < 0xf) {
              *dst = cVar34;
            }
            else {
              uVar40 = (ulong)(iVar10 - 0xfU) + lVar36;
              *dst = -0x10;
              if (0xfe < (int)uVar40) {
                if (0x1fc < (int)uVar17) {
                  uVar17 = 0x1fd;
                }
                uVar25 = (iVar10 - uVar17) + iVar16 + 0xef;
                memset(psVar39,0xff,(ulong)(uVar25 / 0xff + 1));
                psVar39 = (short *)((long)dst + (ulong)uVar25 / 0xff + 2);
                uVar40 = (ulong)(iVar10 + -0x10e + iVar16 + uVar25 / 0xff);
              }
              *(char *)psVar39 = (char)uVar40;
              psVar39 = (short *)((long)psVar39 + 1);
            }
            psVar13 = (short *)((ulong)(uint)((int)piVar8 - (int)piVar28) + (long)psVar39);
            do {
              *(undefined8 *)psVar39 = *(undefined8 *)piVar28;
              psVar39 = psVar39 + 4;
              piVar28 = piVar28 + 2;
              piVar12 = piVar29;
              local_c8 = (long *)dst;
            } while (psVar39 < psVar13);
            do {
              *psVar13 = (short)piVar8 - (short)piVar12;
              puVar19 = (ulong *)(piVar8 + 1);
              puVar20 = (ulong *)(piVar12 + 1);
              puVar14 = puVar19;
              if (puVar19 < src + ((ulong)(uint)srcSize - 0xc)) {
                uVar6 = *(ulong *)(piVar8 + 1) ^ *(ulong *)(piVar12 + 1);
                uVar40 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
                uVar40 = uVar40 >> 3 & 0x1fffffff;
                puVar14 = (ulong *)(piVar8 + 3);
                puVar20 = (ulong *)(piVar12 + 3);
                if (*(ulong *)(piVar12 + 1) == *(ulong *)(piVar8 + 1)) goto LAB_0013aa89;
              }
              else {
LAB_0013aa89:
                do {
                  if (src + ((ulong)(uint)srcSize - 0xc) <= puVar14) {
                    if ((puVar14 < src + ((ulong)(uint)srcSize - 8)) &&
                       ((int)*puVar20 == (int)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 4);
                      puVar20 = (ulong *)((long)puVar20 + 4);
                    }
                    if ((puVar14 < src + ((ulong)(uint)srcSize - 6)) &&
                       ((short)*puVar20 == (short)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 2);
                      puVar20 = (ulong *)((long)puVar20 + 2);
                    }
                    if (puVar14 < src + ((ulong)(uint)srcSize - 5)) {
                      puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar20 == (char)*puVar14))
                      ;
                    }
                    uVar40 = (ulong)(uint)((int)puVar14 - (int)puVar19);
                    goto LAB_0013aac4;
                  }
                  uVar40 = *puVar20;
                  uVar6 = *puVar14;
                  uVar33 = uVar6 ^ uVar40;
                  uVar31 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  iVar10 = (int)puVar14;
                  puVar20 = puVar20 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar40 == uVar6);
                uVar40 = (ulong)((((uint)(uVar31 >> 3) & 0x1fffffff) + iVar10) - (int)puVar19);
              }
LAB_0013aac4:
              dst = (char *)(psVar13 + 1);
              uVar25 = (uint)uVar40;
              if (uVar25 < 0xf) {
                *(char *)local_c8 = (char)*local_c8 + (char)uVar40;
              }
              else {
                *(char *)local_c8 = (char)*local_c8 + '\x0f';
                uVar17 = uVar25 - 0xf;
                *(short *)((long)dst + 0) = -1;
                *(short *)((long)dst + 2) = -1;
                if (0x3fb < uVar17) {
                  uVar25 = uVar25 - 0x40b;
                  memset(psVar13 + 3,0xff,(ulong)((uVar25 / 0x3fc) * 4 + 4));
                  uVar17 = uVar25 % 0x3fc;
                  dst = (char *)((long)psVar13 + (ulong)((uVar25 / 0x3fc) * 4) + 6);
                }
                pcVar38 = (char *)((long)dst + (ulong)uVar17 / 0xff);
                dst = pcVar38 + 1;
                *pcVar38 = (char)(uVar17 / 0xff) + (char)uVar17;
              }
              lVar7 = (long)piVar8 + uVar40;
              piVar8 = (int *)(lVar7 + 4);
              piVar28 = piVar8;
              if (src + ((ulong)(uint)srcSize - 0xb) <= piVar8) {
                iVar10 = 3;
                piVar24 = piVar8;
                goto LAB_0013ac27;
              }
              *(short *)((long)state +
                        (ulong)((uint)(*(int *)(lVar7 + 2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)lVar7 + 2) - sVar2;
              uVar40 = (ulong)((uint)(*piVar8 * -0x61c8864f) >> 0x13);
              uVar1 = *(ushort *)((long)state + uVar40 * 2);
              piVar12 = (int *)((ulong)uVar1 + lVar22);
              *(short *)((long)state + uVar40 * 2) = (short)piVar8 - sVar2;
              bVar44 = true;
              psVar13 = (short *)dst;
              if ((uVar21 <= uVar1) && (*piVar12 == *piVar8)) {
                *dst = '\0';
                bVar44 = false;
                psVar13 = (short *)((long)dst + 1);
                local_c8 = (long *)dst;
              }
            } while (!bVar44);
            uVar42 = (uint)(*(int *)(lVar7 + 5) * -0x61c8864f) >> 0x13;
            iVar10 = 0;
            dst = (char *)psVar13;
            piVar24 = (int *)(lVar7 + 5);
          }
LAB_0013ac27:
        } while (iVar10 == 0);
        if (1 < iVar10 - 2U) {
          return 0;
        }
      }
      pcVar38 = src + ((ulong)(uint)srcSize - (long)piVar28);
      if (pcVar38 < (char *)0xf) {
        *dst = (char)pcVar38 << 4;
      }
      else {
        pcVar23 = pcVar38 + -0xf;
        *dst = -0x10;
        psVar39 = (short *)((long)dst + 1);
        if ((char *)0xfe < pcVar23) {
          uVar40 = (ulong)(pcVar38 + -0x10e) / 0xff;
          memset(psVar39,0xff,uVar40 + 1);
          psVar39 = (short *)((long)dst + uVar40 + 2);
          pcVar23 = pcVar38 + uVar40 * -0xff + -0x10e;
        }
        *(char *)psVar39 = (char)pcVar23;
        dst = (char *)psVar39;
      }
      memcpy((char *)((long)dst + 1),piVar28,(size_t)pcVar38);
      iVar35 = (int)(char *)((long)dst + 1) + (int)pcVar38;
      goto LAB_0013b7d0;
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    if (srcSize == 0) goto LAB_0013a1ed;
    pcVar38 = src + (uint)srcSize;
    *(int *)((long)state + 0x4018) = srcSize;
    *(int *)((long)state + 0x4000) = srcSize;
    *(undefined4 *)((long)state + 0x4004) = 3;
    if (0xc < srcSize) {
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
      plVar18 = (long *)(src + 1);
      uVar21 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
      pcVar23 = pcVar38;
      do {
        uVar25 = 1;
        plVar27 = plVar18;
        uVar42 = iVar35 << 6;
        do {
          plVar18 = plVar27;
          plVar27 = (long *)((ulong)uVar25 + (long)plVar18);
          if (src + ((ulong)(uint)srcSize - 0xb) < plVar27) {
            iVar10 = 2;
          }
          else {
            uVar1 = *(ushort *)((long)state + (ulong)uVar21 * 2);
            lVar22 = *plVar27;
            *(short *)((long)state + (ulong)uVar21 * 2) = (short)plVar18 - sVar2;
            iVar10 = 7;
            if (*(int *)(src + uVar1) != (int)*plVar18) {
              iVar10 = 0;
            }
            pcVar23 = src + uVar1;
            uVar21 = (uint)((int)lVar22 * -0x61c8864f) >> 0x13;
          }
          uVar25 = uVar42 >> 6;
          uVar42 = uVar42 + 1;
        } while (iVar10 == 0);
        if (iVar10 == 7) {
          iVar10 = 0;
        }
        if (iVar10 == 0) {
          iVar10 = (int)plVar18 - (int)plVar41;
          lVar22 = 0;
          cVar3 = (char)plVar18 * '\x10' + (char)plVar41 * -0x10;
          uVar42 = iVar10 - 0xfU;
          do {
            uVar25 = uVar42;
            cVar34 = cVar3;
            lVar7 = lVar22;
            pcVar43 = pcVar23 + lVar7;
            plVar27 = (long *)((long)plVar18 + lVar7);
            if ((pcVar43 <= src) || (plVar27 <= plVar41)) break;
            lVar22 = lVar7 + -1;
            cVar3 = cVar34 + -0x10;
            uVar42 = uVar25 - 1;
          } while (*(char *)((long)plVar18 + lVar7 + -1) == pcVar23[lVar7 + -1]);
          iVar16 = (int)lVar7;
          plVar18 = (long *)((long)dst + 1);
          if ((uint)(iVar10 + iVar16) < 0xf) {
            *dst = cVar34;
          }
          else {
            uVar40 = (ulong)(iVar10 - 0xfU) + lVar7;
            *dst = -0x10;
            if (0xfe < (int)uVar40) {
              if (0x1fc < (int)uVar25) {
                uVar25 = 0x1fd;
              }
              uVar42 = (iVar10 - uVar25) + iVar16 + 0xef;
              memset(plVar18,0xff,(ulong)(uVar42 / 0xff + 1));
              plVar18 = (long *)((long)dst + (ulong)uVar42 / 0xff + 2);
              uVar40 = (ulong)(iVar10 + -0x10e + iVar16 + uVar42 / 0xff);
            }
            *(char *)plVar18 = (char)uVar40;
            plVar18 = (long *)((long)plVar18 + 1);
          }
          plVar5 = (long *)((ulong)(uint)((int)plVar27 - (int)plVar41) + (long)plVar18);
          do {
            *plVar18 = *plVar41;
            plVar18 = plVar18 + 1;
            plVar41 = plVar41 + 1;
            plVar11 = (long *)dst;
          } while (plVar18 < plVar5);
          do {
            *(short *)plVar5 = (short)plVar27 - (short)pcVar43;
            puVar20 = (ulong *)((long)plVar27 + 4);
            puVar14 = (ulong *)(pcVar43 + 4);
            puVar19 = puVar20;
            if (puVar20 < pcVar38 + -0xc) {
              uVar6 = *(ulong *)((long)plVar27 + 4) ^ *(ulong *)(pcVar43 + 4);
              uVar40 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              puVar19 = (ulong *)((long)plVar27 + 0xc);
              puVar14 = (ulong *)(pcVar43 + 0xc);
              if (*(ulong *)(pcVar43 + 4) == *(ulong *)((long)plVar27 + 4)) goto LAB_0013b551;
            }
            else {
LAB_0013b551:
              do {
                if (pcVar38 + -0xc <= puVar19) {
                  if ((puVar19 < pcVar38 + -8) && ((int)*puVar14 == (int)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 4);
                    puVar14 = (ulong *)((long)puVar14 + 4);
                  }
                  if ((puVar19 < pcVar38 + -6) && ((short)*puVar14 == (short)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 2);
                    puVar14 = (ulong *)((long)puVar14 + 2);
                  }
                  if (puVar19 < src + ((ulong)(uint)srcSize - 5)) {
                    puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar14 == (char)*puVar19));
                  }
                  uVar40 = (ulong)(uint)((int)puVar19 - (int)puVar20);
                  goto LAB_0013b58c;
                }
                uVar40 = *puVar14;
                uVar6 = *puVar19;
                uVar33 = uVar6 ^ uVar40;
                uVar31 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                iVar10 = (int)puVar19;
                puVar14 = puVar14 + 1;
                puVar19 = puVar19 + 1;
              } while (uVar40 == uVar6);
              uVar40 = (ulong)((((uint)(uVar31 >> 3) & 0x1fffffff) + iVar10) - (int)puVar20);
            }
LAB_0013b58c:
            dst = (char *)((long)plVar5 + 2);
            uVar42 = (uint)uVar40;
            if (uVar42 < 0xf) {
              *(char *)plVar11 = (char)*plVar11 + (char)uVar40;
            }
            else {
              *(char *)plVar11 = (char)*plVar11 + '\x0f';
              uVar25 = uVar42 - 0xf;
              *(undefined4 *)dst = 0xffffffff;
              if (0x3fb < uVar25) {
                uVar42 = uVar42 - 0x40b;
                memset((char *)((long)plVar5 + 6),0xff,(ulong)((uVar42 / 0x3fc) * 4 + 4));
                uVar25 = uVar42 % 0x3fc;
                dst = (char *)((long)plVar5 + (ulong)((uVar42 / 0x3fc) * 4) + 6);
              }
              pcVar23 = (char *)((long)dst + (ulong)uVar25 / 0xff);
              dst = pcVar23 + 1;
              *pcVar23 = (char)(uVar25 / 0xff) + (char)uVar25;
            }
            lVar22 = (long)plVar27 + uVar40;
            plVar27 = (long *)(lVar22 + 4);
            plVar41 = plVar27;
            if (src + ((ulong)(uint)srcSize - 0xb) <= plVar27) {
              iVar10 = 3;
              pcVar23 = pcVar43;
              plVar18 = plVar27;
              goto LAB_0013b6d7;
            }
            *(short *)((long)state + (ulong)((uint)(*(int *)(lVar22 + 2) * -0x61c8864f) >> 0x13) * 2
                      ) = ((short)lVar22 + 2) - sVar2;
            uVar40 = (ulong)((uint)(*(int *)plVar27 * -0x61c8864f) >> 0x13);
            uVar1 = *(ushort *)((long)state + uVar40 * 2);
            *(short *)((long)state + uVar40 * 2) = (short)plVar27 - sVar2;
            iVar10 = *(int *)(src + uVar1);
            iVar16 = *(int *)plVar27;
            plVar5 = (long *)dst;
            if (iVar10 == iVar16) {
              *dst = '\0';
              plVar5 = (long *)((long)dst + 1);
              plVar11 = (long *)dst;
            }
            pcVar43 = src + uVar1;
          } while (iVar10 == iVar16);
          uVar21 = (uint)(*(int *)(lVar22 + 5) * -0x61c8864f) >> 0x13;
          iVar10 = 0;
          dst = (char *)plVar5;
          pcVar23 = pcVar43;
          plVar18 = (long *)(lVar22 + 5);
        }
LAB_0013b6d7:
      } while (iVar10 == 0);
      if (1 < iVar10 - 2U) {
        return 0;
      }
    }
    pcVar38 = pcVar38 + -(long)plVar41;
    if (pcVar38 < (char *)0xf) {
      *dst = (char)pcVar38 << 4;
    }
    else {
      pcVar23 = pcVar38 + -0xf;
      *dst = -0x10;
      plVar18 = (long *)((long)dst + 1);
      if ((char *)0xfe < pcVar23) {
        uVar40 = (ulong)(pcVar38 + -0x10e) / 0xff;
        memset(plVar18,0xff,uVar40 + 1);
        plVar18 = (long *)((long)dst + uVar40 + 2);
        pcVar23 = pcVar38 + uVar40 * -0xff + -0x10e;
      }
      *(char *)plVar18 = (char)pcVar23;
      dst = (char *)plVar18;
    }
  }
  else {
    if (iVar16 != 0) {
      memset(state,0,0x4008);
    }
    if (*(int *)((long)state + 0x4000) != 0) {
      *(int *)((long)state + 0x4000) = *(int *)((long)state + 0x4000) + 0x10000;
    }
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    *(undefined4 *)((long)state + 0x4018) = 0;
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    uVar21 = *(uint *)((long)state + 0x4000);
    lVar22 = (long)src - (ulong)uVar21;
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar21;
    *(undefined4 *)((long)state + 0x4004) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar21;
    plVar18 = (long *)(src + 1);
    uVar40 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    do {
      uVar42 = 1;
      uVar21 = iVar35 << 6;
      while( true ) {
        plVar27 = (long *)((ulong)uVar42 + (long)plVar18);
        iVar10 = (int)lVar22;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar27) {
          iVar16 = 2;
        }
        else {
          uVar42 = *(uint *)((long)state + uVar40 * 4);
          uVar25 = (int)plVar18 - iVar10;
          piVar12 = (int *)((ulong)uVar42 + lVar22);
          uVar6 = (ulong)(*plVar27 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)state + uVar40 * 4) = uVar25;
          iVar16 = 8;
          uVar40 = uVar6;
          if ((uVar25 <= uVar42 + 0xffff) && (iVar16 = 7, *piVar12 != (int)*plVar18)) {
            iVar16 = 0;
          }
        }
        if ((iVar16 != 0) && (iVar16 != 8)) break;
        uVar42 = uVar21 >> 6;
        uVar21 = uVar21 + 1;
        plVar18 = plVar27;
      }
      if (iVar16 == 7) {
        iVar16 = 0;
      }
      if (iVar16 == 0) {
        iVar16 = (int)plVar18 - (int)plVar41;
        lVar7 = 0;
        uVar21 = iVar16 - 0xfU;
        cVar3 = (char)plVar18 * '\x10' + (char)plVar41 * -0x10;
        do {
          cVar34 = cVar3;
          uVar42 = uVar21;
          lVar36 = lVar7;
          piVar28 = (int *)((long)piVar12 + lVar36);
          plVar27 = (long *)((long)plVar18 + lVar36);
          if ((piVar28 <= src) || (plVar27 <= plVar41)) break;
          lVar7 = lVar36 + -1;
          uVar21 = uVar42 - 1;
          cVar3 = cVar34 + -0x10;
        } while (*(char *)((long)plVar18 + lVar36 + -1) == *(char *)((long)piVar12 + lVar36 + -1));
        iVar15 = (int)lVar36;
        plVar18 = (long *)((long)dst + 1);
        if ((uint)(iVar16 + iVar15) < 0xf) {
          *dst = cVar34;
        }
        else {
          uVar6 = (ulong)(iVar16 - 0xfU) + lVar36;
          *dst = -0x10;
          if (0xfe < (int)uVar6) {
            if (0x1fc < (int)uVar42) {
              uVar42 = 0x1fd;
            }
            uVar21 = (iVar16 - uVar42) + iVar15 + 0xef;
            memset(plVar18,0xff,(ulong)(uVar21 / 0xff + 1));
            plVar18 = (long *)((long)dst + (ulong)uVar21 / 0xff + 2);
            uVar6 = (ulong)(iVar16 + -0x10e + iVar15 + uVar21 / 0xff);
          }
          *(char *)plVar18 = (char)uVar6;
          plVar18 = (long *)((long)plVar18 + 1);
        }
        plVar5 = (long *)((ulong)(uint)((int)plVar27 - (int)plVar41) + (long)plVar18);
        do {
          *plVar18 = *plVar41;
          plVar18 = plVar18 + 1;
          plVar41 = plVar41 + 1;
          piVar12 = piVar28;
          local_c8 = (long *)dst;
        } while (plVar18 < plVar5);
        do {
          *(short *)plVar5 = (short)plVar27 - (short)piVar12;
          puVar19 = (ulong *)((long)plVar27 + 4);
          puVar20 = (ulong *)(piVar12 + 1);
          puVar14 = puVar19;
          if (puVar19 < src + ((ulong)(uint)srcSize - 0xc)) {
            uVar31 = *(ulong *)((long)plVar27 + 4) ^ *(ulong *)(piVar12 + 1);
            uVar6 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar6 = uVar6 >> 3 & 0x1fffffff;
            puVar14 = (ulong *)((long)plVar27 + 0xc);
            puVar20 = (ulong *)(piVar12 + 3);
            if (*(ulong *)(piVar12 + 1) == *(ulong *)((long)plVar27 + 4)) goto LAB_00139e4f;
          }
          else {
LAB_00139e4f:
            do {
              if (src + ((ulong)(uint)srcSize - 0xc) <= puVar14) {
                if ((puVar14 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar20 == (int)*puVar14)
                   ) {
                  puVar14 = (ulong *)((long)puVar14 + 4);
                  puVar20 = (ulong *)((long)puVar20 + 4);
                }
                if ((puVar14 < src + ((ulong)(uint)srcSize - 6)) &&
                   ((short)*puVar20 == (short)*puVar14)) {
                  puVar14 = (ulong *)((long)puVar14 + 2);
                  puVar20 = (ulong *)((long)puVar20 + 2);
                }
                if (puVar14 < src + ((ulong)(uint)srcSize - 5)) {
                  puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar20 == (char)*puVar14));
                }
                uVar6 = (ulong)(uint)((int)puVar14 - (int)puVar19);
                goto LAB_00139e8a;
              }
              uVar6 = *puVar20;
              uVar31 = *puVar14;
              uVar30 = uVar31 ^ uVar6;
              uVar33 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              iVar16 = (int)puVar14;
              puVar20 = puVar20 + 1;
              puVar14 = puVar14 + 1;
            } while (uVar6 == uVar31);
            uVar6 = (ulong)((((uint)(uVar33 >> 3) & 0x1fffffff) + iVar16) - (int)puVar19);
          }
LAB_00139e8a:
          dst = (char *)((long)plVar5 + 2);
          uVar21 = (uint)uVar6;
          if (uVar21 < 0xf) {
            *(char *)local_c8 = (char)*local_c8 + (char)uVar6;
          }
          else {
            *(char *)local_c8 = (char)*local_c8 + '\x0f';
            uVar42 = uVar21 - 0xf;
            *(undefined4 *)dst = 0xffffffff;
            if (0x3fb < uVar42) {
              uVar21 = uVar21 - 0x40b;
              memset((char *)((long)plVar5 + 6),0xff,(ulong)((uVar21 / 0x3fc) * 4 + 4));
              uVar42 = uVar21 % 0x3fc;
              dst = (char *)((long)plVar5 + (ulong)((uVar21 / 0x3fc) * 4) + 6);
            }
            pcVar38 = (char *)((long)dst + (ulong)uVar42 / 0xff);
            dst = pcVar38 + 1;
            *pcVar38 = (char)(uVar42 / 0xff) + (char)uVar42;
          }
          lVar7 = (long)plVar27 + uVar6;
          plVar27 = (long *)(lVar7 + 4);
          plVar41 = plVar27;
          if (src + ((ulong)(uint)srcSize - 0xb) <= plVar27) {
            iVar16 = 3;
            plVar18 = plVar27;
            goto LAB_00139ffc;
          }
          *(int *)((long)state + ((ulong)(*(long *)(lVar7 + 2) * -0x30e4432345000000) >> 0x34) * 4)
               = ((int)lVar7 + 2) - iVar10;
          uVar6 = (ulong)(*plVar27 * -0x30e4432345000000) >> 0x34;
          uVar42 = (int)plVar27 - iVar10;
          uVar21 = *(uint *)((long)state + uVar6 * 4);
          piVar12 = (int *)((ulong)uVar21 + lVar22);
          *(uint *)((long)state + uVar6 * 4) = uVar42;
          bVar44 = true;
          plVar5 = (long *)dst;
          if ((uVar42 <= uVar21 + 0xffff) && (*piVar12 == *(int *)plVar27)) {
            *dst = '\0';
            bVar44 = false;
            plVar5 = (long *)((long)dst + 1);
            local_c8 = (long *)dst;
          }
        } while (!bVar44);
        uVar40 = (ulong)(*(long *)(lVar7 + 5) * -0x30e4432345000000) >> 0x34;
        iVar16 = 0;
        dst = (char *)plVar5;
        plVar18 = (long *)(lVar7 + 5);
      }
LAB_00139ffc:
    } while (iVar16 == 0);
    if (1 < iVar16 - 2U) {
      return 0;
    }
    pcVar38 = src + ((ulong)(uint)srcSize - (long)plVar41);
    if (pcVar38 < (char *)0xf) {
      *dst = (char)pcVar38 << 4;
    }
    else {
      pcVar23 = pcVar38 + -0xf;
      *dst = -0x10;
      plVar18 = (long *)((long)dst + 1);
      if ((char *)0xfe < pcVar23) {
        uVar40 = (ulong)(pcVar38 + -0x10e) / 0xff;
        memset(plVar18,0xff,uVar40 + 1);
        plVar18 = (long *)((long)dst + uVar40 + 2);
        pcVar23 = pcVar38 + uVar40 * -0xff + -0x10e;
      }
      *(char *)plVar18 = (char)pcVar23;
      dst = (char *)plVar18;
    }
  }
  memcpy((char *)((long)dst + 1),plVar41,(size_t)pcVar38);
  iVar35 = (int)(char *)((long)dst + 1) + (int)pcVar38;
LAB_0013b7d0:
  return iVar35 - iVar4;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}